

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eoserver.cpp
# Opt level: O2

void server_pump_queue(void *server_void)

{
  EOClient *client;
  long lVar1;
  _Elt_pointer puVar2;
  bool bVar3;
  PacketFamily family;
  PacketAction action_00;
  int iVar4;
  IPAddress IVar5;
  size_type sVar6;
  mapped_type *this;
  long *plVar7;
  long *plVar8;
  unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_> action;
  _Head_base<0UL,_ActionQueue_Action_*,_false> local_70;
  long *local_68;
  key_type local_60;
  double local_40;
  void *local_38;
  
  local_40 = Timer::GetTime();
  plVar7 = (long *)((long)server_void + 0x38);
  plVar8 = plVar7;
  local_68 = plVar7;
  local_38 = server_void;
  while (plVar7 = (long *)*plVar7, plVar7 != plVar8) {
    client = (EOClient *)plVar7[2];
    bVar3 = Client::Connected((Client *)client);
    if (bVar3) {
      sVar6 = std::
              deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
              ::size((deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
                      *)&client->queue);
      lVar1 = *(long *)((long)local_38 + 0x90);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,"PacketQueueMax",(allocator<char> *)&local_70);
      this = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)(lVar1 + 0x198),&local_60);
      iVar4 = util::variant::GetInt(this);
      std::__cxx11::string::~string((string *)&local_60);
      plVar8 = local_68;
      if ((ulong)(long)iVar4 < sVar6) {
        IVar5 = Client::GetRemoteAddr((Client *)client);
        local_70._M_head_impl._0_4_ = IVar5.address;
        IPAddress::operator_cast_to_string(&local_60,(IPAddress *)&local_70);
        Console::Wrn("Client was disconnected for filling up the action queue: %s");
        std::__cxx11::string::~string((string *)&local_60);
        Client::Close((Client *)client,false);
        plVar8 = local_68;
      }
      else if ((sVar6 != 0) && ((client->queue).next <= local_40)) {
        puVar2 = (client->queue).queue.c.
                 super__Deque_base<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        local_70._M_head_impl =
             (puVar2->_M_t).
             super___uniq_ptr_impl<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>.
             _M_t.
             super__Tuple_impl<0UL,_ActionQueue_Action_*,_std::default_delete<ActionQueue_Action>_>.
             super__Head_base<0UL,_ActionQueue_Action_*,_false>._M_head_impl;
        (puVar2->_M_t).
        super___uniq_ptr_impl<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>._M_t.
        super__Tuple_impl<0UL,_ActionQueue_Action_*,_std::default_delete<ActionQueue_Action>_>.
        super__Head_base<0UL,_ActionQueue_Action_*,_false>._M_head_impl = (ActionQueue_Action *)0x0;
        std::
        deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
        ::pop_front((deque<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>,_std::allocator<std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>_>_>
                     *)&client->queue);
        family = PacketReader::Family(&(local_70._M_head_impl)->reader);
        action_00 = PacketReader::Action(&(local_70._M_head_impl)->reader);
        Handlers::Handle(family,action_00,client,&(local_70._M_head_impl)->reader,
                         (bool)((local_70._M_head_impl)->auto_queue ^ 1));
        (client->queue).next = (local_70._M_head_impl)->time + local_40;
        std::unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_>::~unique_ptr
                  ((unique_ptr<ActionQueue_Action,_std::default_delete<ActionQueue_Action>_> *)
                   &local_70);
      }
    }
  }
  return;
}

Assistant:

void server_pump_queue(void *server_void)
{
	EOServer *server = static_cast<EOServer *>(server_void);
	double now = Timer::GetTime();

	UTIL_FOREACH(server->clients, rawclient)
	{
		EOClient *client = static_cast<EOClient *>(rawclient);

		if (!client->Connected())
			continue;

		std::size_t size = client->queue.queue.size();

		if (size > std::size_t(int(server->world->config["PacketQueueMax"])))
		{
			Console::Wrn("Client was disconnected for filling up the action queue: %s", static_cast<std::string>(client->GetRemoteAddr()).c_str());
			client->Close();
			continue;
		}

		if (size != 0 && client->queue.next <= now)
		{
			std::unique_ptr<ActionQueue_Action> action = std::move(client->queue.queue.front());
			client->queue.queue.pop();

#ifndef DEBUG_EXCEPTIONS
			try
			{
#endif // DEBUG_EXCEPTIONS
				Handlers::Handle(action->reader.Family(), action->reader.Action(), client, action->reader, !action->auto_queue);
#ifndef DEBUG_EXCEPTIONS
			}
			catch (Socket_Exception& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("%s: %s", e.what(), e.error());
				client->Close();
			}
			catch (Database_Exception& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("%s: %s", e.what(), e.error());
				client->Close();
			}
			catch (std::runtime_error& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("Runtime Error: %s", e.what());
				client->Close();
			}
			catch (std::logic_error& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("Logic Error: %s", e.what());
				client->Close();
			}
			catch (std::exception& e)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				Console::Err("Uncaught Exception: %s", e.what());
				client->Close();
			}
			catch (...)
			{
				Console::Err("Client caused an exception and was closed: %s.", static_cast<std::string>(client->GetRemoteAddr()).c_str());
				client->Close();
			}
#endif // DEBUG_EXCEPTIONS

			client->queue.next = now + action->time;
		}
	}
}